

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::
write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
           *this,int num_digits,string_view prefix,basic_format_specs<wchar_t> *spec,bin_writer<3> f
          )

{
  type tVar1;
  alignment aVar2;
  uint uVar3;
  size_t sVar4;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *in_RDX;
  int in_ESI;
  align_spec *in_RDI;
  align_spec *in_R8;
  align_spec as;
  size_t padding;
  char_type fill;
  size_t size;
  undefined4 in_stack_ffffffffffffffe0;
  
  sVar4 = basic_string_view<char>::size((basic_string_view<char> *)&stack0xfffffffffffffff0);
  tVar1 = internal::to_unsigned<int>(in_ESI);
  align_spec::fill(in_R8);
  aVar2 = align_spec::align(in_R8);
  if (aVar2 == ALIGN_NUMERIC) {
    uVar3 = align_spec::width(in_R8);
    if (sVar4 + tVar1 < (ulong)uVar3) {
      align_spec::width(in_R8);
      align_spec::width(in_R8);
    }
  }
  else if (in_ESI < (int)in_R8[1].width_) {
    basic_string_view<char>::size((basic_string_view<char> *)&stack0xfffffffffffffff0);
    internal::to_unsigned<int>(in_R8[1].width_);
    internal::to_unsigned<int>(in_R8[1].width_ - in_ESI);
  }
  align_spec::align(in_R8);
  write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>>
            (in_RDX,in_RDI,
             (padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>::int_writer<long_long,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<3>_>
              *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + internal::to_unsigned(num_digits);
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision > num_digits) {
      size = prefix.size() + internal::to_unsigned(spec.precision);
      padding = internal::to_unsigned(spec.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(as, padded_int_writer<F>{size, prefix, fill, padding, f});
  }